

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_serial_unix.cxx
# Opt level: O1

int ndiSerialTimeout(int serial_port,int milliseconds)

{
  int iVar1;
  termios t;
  termios local_4c;
  
  iVar1 = tcgetattr(serial_port,&local_4c);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    local_4c.c_cc[6] = '\0';
    local_4c.c_cc[5] =
         (char)(uint)((ulong)((long)milliseconds * 0x51eb851f) >> 0x25) -
         (char)(milliseconds >> 0x1f);
    iVar1 = tcsetattr(serial_port,0,&local_4c);
    iVar1 = -(uint)(iVar1 == -1);
  }
  return iVar1;
}

Assistant:

ndicapiExport int ndiSerialTimeout(int serial_port, int milliseconds)
{
  struct termios t;

  if (tcgetattr(serial_port, &t) == -1)
  {
    return -1;
  }

  t.c_cc[VMIN] = 0;                  /* use constant, not interval timout */
  t.c_cc[VTIME] = milliseconds / 100; /* wait time is in 10ths of a second */

  if (tcsetattr(serial_port, TCSANOW, &t) == -1)
  {
    return -1;
  }

  return 0;
}